

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall Json::Reader::readNumber(Reader *this)

{
  Char local_31;
  Char local_2f;
  char local_2e;
  Char local_2d;
  Char local_2b;
  Char local_2a;
  char local_19;
  Location pCStack_18;
  char c;
  Location p;
  Reader *this_local;
  
  pCStack_18 = this->current_;
  local_19 = '0';
  while ('/' < local_19 && local_19 < ':') {
    this->current_ = pCStack_18;
    if (pCStack_18 < this->end_) {
      local_2a = *pCStack_18;
      pCStack_18 = pCStack_18 + 1;
    }
    else {
      local_2a = '\0';
    }
    local_19 = local_2a;
  }
  if (local_19 == '.') {
    this->current_ = pCStack_18;
    if (pCStack_18 < this->end_) {
      local_2b = *pCStack_18;
      pCStack_18 = pCStack_18 + 1;
    }
    else {
      local_2b = '\0';
    }
    local_19 = local_2b;
    while ('/' < local_19 && local_19 < ':') {
      this->current_ = pCStack_18;
      if (pCStack_18 < this->end_) {
        local_2d = *pCStack_18;
        pCStack_18 = pCStack_18 + 1;
      }
      else {
        local_2d = '\0';
      }
      local_19 = local_2d;
    }
  }
  if ((local_19 == 'e') || (local_19 == 'E')) {
    this->current_ = pCStack_18;
    if (pCStack_18 < this->end_) {
      local_2e = *pCStack_18;
      pCStack_18 = pCStack_18 + 1;
    }
    else {
      local_2e = '\0';
    }
    local_19 = local_2e;
    if ((local_2e == '+') || (local_2e == '-')) {
      this->current_ = pCStack_18;
      if (pCStack_18 < this->end_) {
        local_2f = *pCStack_18;
        pCStack_18 = pCStack_18 + 1;
      }
      else {
        local_2f = '\0';
      }
      local_19 = local_2f;
    }
    while ('/' < local_19 && local_19 < ':') {
      this->current_ = pCStack_18;
      if (pCStack_18 < this->end_) {
        local_31 = *pCStack_18;
        pCStack_18 = pCStack_18 + 1;
      }
      else {
        local_31 = '\0';
      }
      local_19 = local_31;
    }
  }
  return;
}

Assistant:

void Reader::readNumber() {
  Location p = current_;
  char c = '0'; // stopgap for already consumed character
  // integral part
  while (c >= '0' && c <= '9')
    c = (current_ = p) < end_ ? *p++ : '\0';
  // fractional part
  if (c == '.') {
    c = (current_ = p) < end_ ? *p++ : '\0';
    while (c >= '0' && c <= '9')
      c = (current_ = p) < end_ ? *p++ : '\0';
  }
  // exponential part
  if (c == 'e' || c == 'E') {
    c = (current_ = p) < end_ ? *p++ : '\0';
    if (c == '+' || c == '-')
      c = (current_ = p) < end_ ? *p++ : '\0';
    while (c >= '0' && c <= '9')
      c = (current_ = p) < end_ ? *p++ : '\0';
  }
}